

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void decompose(uint32_t n)

{
  uint local_10;
  uint local_c;
  int i;
  uint32_t n_local;
  
  printf("%u = ",(ulong)n);
  local_10 = 0;
  local_c = n;
  while (local_c != 0) {
    printf("%d*10^%d",(ulong)local_c % 10,(ulong)local_10);
    local_c = local_c / 10;
    if (local_c != 0) {
      printf(" + ");
    }
    local_10 = local_10 + 1;
  }
  printf("\n");
  return;
}

Assistant:

void decompose(uint32_t n) {
  printf("%" PRIu32 " = ", n);
  for (int i = 0; n; i++) {
    printf("%d*10^%d", n % 10, i);
    n /= 10;
    if (n) printf(" + ");
  }
  printf("\n");
}